

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O1

unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> __thiscall
helics::core::anon_unknown_5::makeCLITypeApp
          (anon_unknown_5 *this,string *corestring,string *namestring)

{
  _Manager_type p_Var1;
  _Invoker_type p_Var2;
  undefined8 uVar3;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  HelicsConfigJSON *pHVar4;
  App *pAVar5;
  Option *pOVar6;
  pointer *__ptr;
  _Any_data __tmp;
  string local_258;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::make_unique<helics::helicsCLI11App,char_const(&)[20]>((char (*) [20])this);
  helicsCLI11App::remove_helics_specifics(*(helicsCLI11App **)this);
  pAVar5 = *(App **)this;
  (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = true;
  (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = true;
  pAVar5->allow_extras_ = true;
  pAVar5->allow_config_extras_ = ignore_all;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--config-file,--config","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Read an ini file","");
  CLI::App::set_config(pAVar5,&local_230,&local_90,&local_258,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = *(App **)this;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"--name,--identifier","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar5,&local_b0,namestring,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pHVar4 = addJsonConfig(*(App **)this);
  (pHVar4->super_ConfigBase).maximumLayers = '\0';
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"helics","");
  _GLOBAL__N_1::makeCLITypeApp();
  pAVar5 = *(App **)this;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"network type","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  pAVar5 = &CLI::App::add_option_group<CLI::Option_group>(pAVar5,&local_f0,&local_110)->super_App;
  pAVar5->immediate_callback_ = true;
  p_Var1 = (pAVar5->final_callback_).super__Function_base._M_manager;
  if ((p_Var1 != (_Manager_type)0x0) &&
     ((pAVar5->parse_complete_callback_).super__Function_base._M_manager == (_Manager_type)0x0)) {
    local_258._M_dataplus._M_p =
         *(pointer *)&(pAVar5->final_callback_).super__Function_base._M_functor;
    local_258._M_string_length =
         *(size_type *)((long)&(pAVar5->final_callback_).super__Function_base._M_functor + 8);
    uVar3 = *(undefined8 *)
             ((long)&(pAVar5->parse_complete_callback_).super__Function_base._M_functor + 8);
    *(undefined8 *)&(pAVar5->final_callback_).super__Function_base._M_functor =
         *(undefined8 *)&(pAVar5->parse_complete_callback_).super__Function_base._M_functor;
    *(undefined8 *)((long)&(pAVar5->final_callback_).super__Function_base._M_functor + 8) = uVar3;
    *(pointer *)&(pAVar5->parse_complete_callback_).super__Function_base._M_functor =
         local_258._M_dataplus._M_p;
    *(size_type *)((long)&(pAVar5->parse_complete_callback_).super__Function_base._M_functor + 8) =
         local_258._M_string_length;
    (pAVar5->final_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (pAVar5->parse_complete_callback_).super__Function_base._M_manager = p_Var1;
    p_Var2 = (pAVar5->final_callback_)._M_invoker;
    (pAVar5->final_callback_)._M_invoker = (pAVar5->parse_complete_callback_)._M_invoker;
    (pAVar5->parse_complete_callback_)._M_invoker = p_Var2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"--core","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar5,&local_130,corestring,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"--coretype,-t","");
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
  pOVar6 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar5,&local_170,corestring,&local_190);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"HELICS_CORE_TYPE","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar6->envname_,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = *(App **)this;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"broker","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  pAVar5 = CLI::App::add_subcommand(pAVar5,&local_1b0,&local_1d0);
  pAVar5->fallthrough_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = *(App **)this;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"core","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
  pAVar5 = CLI::App::add_subcommand(pAVar5,&local_1f0,&local_210);
  pAVar5->fallthrough_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
          )(__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<helicsCLI11App> makeCLITypeApp(std::string& corestring, std::string& namestring)
    {
        auto app = std::make_unique<helicsCLI11App>("type extraction app");
        app->remove_helics_specifics();
        app->option_defaults()->ignore_case()->ignore_underscore();
        app->allow_config_extras(CLI::config_extras_mode::ignore_all);
        app->allow_extras();
        app->set_config("--config-file,--config", "");
        app->add_option("--name,--identifier", namestring);
        auto* fmtr = addJsonConfig(app.get());
        fmtr->maxLayers(0);
        fmtr->promoteSection("helics");
        auto* networking = app->add_option_group("network type")->immediate_callback();
        networking->add_option("--core", corestring);
        networking->add_option("--coretype,-t", corestring)->envname("HELICS_CORE_TYPE");
        app->add_subcommand("broker")->fallthrough();
        app->add_subcommand("core")->fallthrough();
        return app;
    }